

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdesc.hpp
# Opt level: O2

Desc * __thiscall
soplex::
SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::Desc::operator=(Desc *this,Desc *rhs)

{
  DataArray<soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status>
  *this_00;
  Desc *pDVar1;
  Desc *pDVar2;
  
  if (this != rhs) {
    DataArray<soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status>
    ::operator=(&this->rowstat,&rhs->rowstat);
    this_00 = &this->colstat;
    DataArray<soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status>
    ::operator=(this_00,&rhs->colstat);
    pDVar2 = (Desc *)this_00;
    pDVar1 = this;
    if ((Desc *)rhs->stat != rhs) {
      pDVar2 = this;
      pDVar1 = (Desc *)this_00;
    }
    this->stat = &pDVar1->rowstat;
    this->costat = &pDVar2->rowstat;
  }
  return this;
}

Assistant:

typename SPxBasisBase<R>::Desc& SPxBasisBase<R>::Desc::operator=(const typename
      SPxBasisBase<R>::Desc& rhs)
{
   if(this != &rhs)
   {
      rowstat = rhs.rowstat;
      colstat = rhs.colstat;

      if(rhs.stat == &rhs.rowstat)
      {
         assert(rhs.costat == &rhs.colstat);

         stat   = &rowstat;
         costat = &colstat;
      }
      else
      {
         assert(rhs.costat == &rhs.rowstat);

         stat   = &colstat;
         costat = &rowstat;
      }

      assert(Desc::isConsistent());
   }

   return *this;
}